

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGccDepfileLexerHelper.cxx
# Opt level: O3

bool __thiscall cmGccDepfileLexerHelper::readFile(cmGccDepfileLexerHelper *this,char *filePath)

{
  FILE *__stream;
  bool bVar1;
  yyscan_t scanner;
  yyscan_t local_20;
  
  __stream = fopen(filePath,"r");
  if (__stream == (FILE *)0x0) {
    bVar1 = false;
  }
  else {
    newEntry(this);
    cmGccDepfile_yylex_init(&local_20);
    cmGccDepfile_yyset_extra((cmFortranParser *)this,local_20);
    cmGccDepfile_yyrestart((FILE *)__stream,local_20);
    cmGccDepfile_yylex(local_20);
    cmGccDepfile_yylex_destroy(local_20);
    sanitizeContent(this);
    fclose(__stream);
    bVar1 = this->HelperState != Failed;
  }
  return bVar1;
}

Assistant:

bool cmGccDepfileLexerHelper::readFile(const char* filePath)
{
#ifdef _WIN32
  wchar_t* wpath = cmsysEncoding_DupToWide(filePath);
  FILE* file = _wfopen(wpath, L"rb");
  free(wpath);
#else
  FILE* file = fopen(filePath, "r");
#endif
  if (!file) {
    return false;
  }
  this->newEntry();
  yyscan_t scanner;
  cmGccDepfile_yylex_init(&scanner);
  cmGccDepfile_yyset_extra(this, scanner);
  cmGccDepfile_yyrestart(file, scanner);
  cmGccDepfile_yylex(scanner);
  cmGccDepfile_yylex_destroy(scanner);
  this->sanitizeContent();
  fclose(file);
  return this->HelperState != State::Failed;
}